

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O0

string * __thiscall
ExtendedMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,ExtendedMatrix *this)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  Fraction *f;
  int local_1a4;
  int local_1a0;
  int column;
  int row;
  ostringstream local_190 [8];
  ostringstream out;
  ExtendedMatrix *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar1 = GetNumRows(this);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,iVar1);
  poVar2 = std::operator<<(poVar2,' ');
  iVar1 = GetNumColumns(this);
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_1a0 = 0;
  while( true ) {
    iVar1 = GetNumRows(this);
    if (iVar1 <= local_1a0) break;
    local_1a4 = 0;
    while( true ) {
      iVar1 = GetNumColumns(this);
      if (iVar1 <= local_1a4) break;
      f = At(this,local_1a0,local_1a4);
      poVar2 = operator<<((ostream *)local_190,f);
      std::operator<<(poVar2,' ');
      local_1a4 = local_1a4 + 1;
    }
    iVar1 = GetNumRows(this);
    if (local_1a0 + 1 != iVar1) {
      std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
    }
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtendedMatrix::ToString() const {
  std::ostringstream out;
  out << GetNumRows() << ' ' << GetNumColumns() << std::endl;
  for (int row = 0; row < GetNumRows(); ++row) {
    for (int column = 0; column < GetNumColumns(); ++column) {
      out << At(row, column) << ' ';
    }
    if (row + 1 != GetNumRows()) {
      out << std::endl;
    }
  }

  return out.str();
}